

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O2

void mapLoad(string *path,
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *obstacles)

{
  istream *piVar1;
  undefined8 *puVar2;
  size_t i;
  __m128d t;
  size_t size;
  string s;
  Point2d pt;
  string error;
  ifstream file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  if ((abStack_218[*(long *)(_file + -0x18)] & 5) != 0) {
    std::operator+(&s,"map of \'",path);
    std::operator+(&error,&s,"\' does not exist.");
    std::__cxx11::string::~string((string *)&s);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = error._M_dataplus._M_p;
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&s);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream((stringstream *)&error);
    std::operator<<((ostream *)error.field_2._M_local_buf,(string *)&s);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::emplace_back<>(obstacles);
    std::istream::_M_extract<unsigned_long>((ulong *)&error);
    std::__cxx11::stringstream::~stringstream((stringstream *)&error);
  }
  std::__cxx11::string::~string((string *)&s);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void mapLoad(std::string path, std::vector<std::vector<cv::Point>>& obstacles) {
    std::ifstream file(path, std::ios::in);
    if (!file) {
        std::string error = "map of '" + path + "' does not exist.";
        throw error.c_str();
    }
    std::string s;
    while (getline(file, s)) {
        std::stringstream ss;
        ss << s;
        obstacles.emplace_back();
        Obstacle& obs = obstacles.back();
        size_t size = 0;
        ss >> size;
        for (size_t i = 0; i < size; i++) {
            cv::Point2d pt;
            ss >> pt.x >> pt.y;
            obs.push_back(pt);
        }
    }
}